

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_job_queue.c
# Opt level: O3

void * ihevcd_jobq_init(void *pv_buf,WORD32 buf_size)

{
  UWORD32 UVar1;
  UWORD32 UVar2;
  uint uVar3;
  long lVar4;
  
  *(long *)((long)pv_buf + 0x20) = (long)pv_buf + 0x30;
  UVar1 = ithread_get_mutex_lock_size();
  UVar2 = ithread_get_mutex_lock_size();
  uVar3 = (buf_size - UVar2) - 0x30;
  if ((int)uVar3 < 1) {
    pv_buf = (void *)0x0;
  }
  else {
    lVar4 = (long)pv_buf + 0x30 + (ulong)UVar1;
    ithread_mutex_init(*(void **)((long)pv_buf + 0x20));
    *(long *)pv_buf = lVar4;
    *(long *)((long)pv_buf + 8) = lVar4;
    *(long *)((long)pv_buf + 0x10) = lVar4;
    *(ulong *)((long)pv_buf + 0x18) = (ulong)uVar3 + lVar4;
    *(undefined4 *)((long)pv_buf + 0x28) = 0;
  }
  return pv_buf;
}

Assistant:

void* ihevcd_jobq_init(void *pv_buf, WORD32 buf_size)
{
    jobq_t *ps_jobq;
    UWORD8 *pu1_buf;
    pu1_buf = (UWORD8 *)pv_buf;

    ps_jobq = (jobq_t *)pu1_buf;
    pu1_buf += sizeof(jobq_t);
    buf_size -= sizeof(jobq_t);

    ps_jobq->pv_mutex = pu1_buf;
    pu1_buf += ithread_get_mutex_lock_size();
    buf_size -= ithread_get_mutex_lock_size();

    if(buf_size <= 0)
        return NULL;

    ithread_mutex_init(ps_jobq->pv_mutex);

    ps_jobq->pv_buf_base = pu1_buf;
    ps_jobq->pv_buf_wr = pu1_buf;
    ps_jobq->pv_buf_rd = pu1_buf;
    ps_jobq->pv_buf_end = pu1_buf + buf_size;
    ps_jobq->i4_terminate = 0;


    return ps_jobq;
}